

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Vector3f __thiscall pbrt::DirectionCone::ClosestVectorInCone(DirectionCone *this,Vector3f wp)

{
  Tuple3<pbrt::Vector3,_float> TVar1;
  float fVar2;
  Vector3<float> *in_RDI;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  uint uVar18;
  uint uVar19;
  Vector3<float> VVar20;
  Vector3f a;
  Float sinTheta;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed8;
  float fVar21;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  float fVar22;
  undefined4 in_stack_fffffffffffffeec;
  float fVar23;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  Tuple3<pbrt::Vector3,_float> local_18;
  Tuple3<pbrt::Vector3,_float> local_c;
  undefined1 extraout_var [60];
  
  auVar17 = in_ZMM0._8_56_;
  local_18._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  VVar20 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  local_18.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar17;
  local_18._0_8_ = vmovlpd_avx(auVar11._0_16_);
  fVar3 = Dot<float>((Vector3<float> *)&local_18,in_RDI);
  if (fVar3 <= in_RDI[1].super_Tuple3<pbrt::Vector3,_float>.x) {
    auVar10 = ZEXT416((uint)in_RDI[1].super_Tuple3<pbrt::Vector3,_float>.x);
    vfnmadd213ss_fma(auVar10,auVar10,SUB6416(ZEXT464(0x3f800000),0));
    auVar12._0_4_ = SafeSqrt(0.0);
    auVar12._4_60_ = extraout_var;
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar10 = auVar12._0_16_ ^ auVar10;
    auVar17 = ZEXT856(auVar10._8_8_);
    uVar4 = auVar10._0_4_;
    VVar20 = Cross<float>((Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    auVar13._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar17;
    vmovlpd_avx(auVar13._0_16_);
    auVar17 = (undefined1  [56])0x0;
    VVar20 = pbrt::operator*(in_stack_fffffffffffffef4,
                             (Tuple3<pbrt::Vector3,_float> *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    auVar14._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar17;
    vmovlpd_avx(auVar14._0_16_);
    Length<float>((Vector3<float> *)0x686be7);
    fVar3 = (in_RDI->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar6 = (in_RDI->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)local_18.y),
                              ZEXT416((uint)(local_18.z *
                                            (in_RDI->super_Tuple3<pbrt::Vector3,_float>).z)));
    uVar18 = auVar10._0_4_;
    fVar21 = local_18.x;
    fVar5 = Sqr<float>(fVar6);
    fVar6 = Sqr<float>((in_RDI->super_Tuple3<pbrt::Vector3,_float>).z);
    vfmsub213ss_fma(ZEXT416(uVar18),ZEXT416((uint)fVar3),ZEXT416((uint)(fVar21 * (fVar5 + fVar6))));
    fVar6 = (in_RDI->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar23 = (in_RDI->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)local_18.x),
                              ZEXT416((uint)(local_18.z *
                                            (in_RDI->super_Tuple3<pbrt::Vector3,_float>).z)));
    uVar19 = auVar10._0_4_;
    fVar22 = local_18.y;
    fVar7 = Sqr<float>(fVar6);
    fVar6 = Sqr<float>((in_RDI->super_Tuple3<pbrt::Vector3,_float>).z);
    fVar2 = local_18.z;
    vfmsub213ss_fma(ZEXT416(uVar19),ZEXT416((uint)fVar23),ZEXT416((uint)(fVar22 * (fVar7 + fVar6))))
    ;
    fVar6 = (in_RDI->super_Tuple3<pbrt::Vector3,_float>).z;
    fVar8 = (in_RDI->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)local_18.x),
                              ZEXT416((uint)(local_18.y *
                                            (in_RDI->super_Tuple3<pbrt::Vector3,_float>).y)));
    fVar8 = Sqr<float>(fVar8);
    fVar9 = Sqr<float>((in_RDI->super_Tuple3<pbrt::Vector3,_float>).y);
    vfmsub213ss_fma(ZEXT416(auVar10._0_4_),ZEXT416((uint)fVar6),
                    ZEXT416((uint)(fVar2 * (fVar8 + fVar9))));
    Vector3<float>::Vector3
              ((Vector3<float> *)CONCAT44(fVar5,uVar4),in_stack_fffffffffffffecc,
               in_stack_fffffffffffffec8,0.0);
    auVar17 = (undefined1  [56])0x0;
    VVar20 = pbrt::operator*(fVar8,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar23,fVar22));
    auVar15._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar17;
    vmovlpd_avx(auVar15._0_16_);
    VVar20 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar7,uVar18),
                        (Vector3<float> *)CONCAT44(fVar3,fVar21));
    local_c.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar17;
    local_c._0_8_ = vmovlpd_avx(auVar16._0_16_);
  }
  else {
    local_c.x = local_18.x;
    local_c.y = local_18.y;
    local_c.z = local_18.z;
  }
  TVar1.z = local_c.z;
  TVar1.x = local_c.x;
  TVar1.y = local_c.y;
  return (Vector3f)TVar1;
}

Assistant:

DirectionCone::ClosestVectorInCone(Vector3f wp) const {
    DCHECK(!empty);
    wp = Normalize(wp);
    // Return provided vector if it is inside the cone
    if (Dot(wp, w) > cosTheta)
        return wp;

    // Find closest vector by rotating _wp_ until it touches the cone
    Float sinTheta = -SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f a = Cross(wp, w);
    return cosTheta * w +
           (sinTheta / Length(a)) *
               Vector3f(w.x * (wp.y * w.y + wp.z * w.z) - wp.x * (Sqr(w.y) + Sqr(w.z)),
                        w.y * (wp.x * w.x + wp.z * w.z) - wp.y * (Sqr(w.x) + Sqr(w.z)),
                        w.z * (wp.x * w.x + wp.y * w.y) - wp.z * (Sqr(w.x) + Sqr(w.y)));
}